

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Object::stSize(InterpreterProxy *interpreter)

{
  Oop OVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  Oop self;
  InterpreterProxy *interpreter_local;
  
  self.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)interpreter;
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    local_20.pointer = (uint8_t *)(**(code **)(*(long *)self.field_0 + 0x58))();
    bVar2 = Oop::isPointer((Oop *)&local_20);
    if (bVar2) {
      bVar2 = Oop::isIndexable((Oop *)&local_20);
      OVar1 = self;
      if (bVar2) {
        sVar4 = Oop::getNumberOfElements((Oop *)&local_20);
        interpreter_local._4_4_ = (**(code **)(*(long *)OVar1.field_0 + 0xa8))(OVar1.field_0,sVar4);
      }
      else {
        interpreter_local._4_4_ = (**(code **)(*(long *)self.field_0 + 0xf0))();
      }
    }
    else {
      interpreter_local._4_4_ = (**(code **)(*(long *)self.field_0 + 0xf0))();
    }
  }
  else {
    interpreter_local._4_4_ = (**(code **)(*(long *)self.field_0 + 0xf0))();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Object::stSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
	if(!self.isPointer())
        return interpreter->primitiveFailed();

	if(!self.isIndexable())
		return interpreter->primitiveFailed();

	return interpreter->returnSmallInteger(self.getNumberOfElements());
}